

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqenc.c
# Opt level: O3

int jpc_mqenc_flush(jpc_mqenc_t *mqenc,int termmode)

{
  uchar *puVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  sbyte sVar7;
  uint uVar8;
  uint_fast32_t uVar9;
  uint_fast32_t uVar10;
  jas_stream_t *pjVar11;
  long lVar12;
  long lVar13;
  
  if (termmode == 0) {
    uVar5 = mqenc->creg | 0xffff;
    uVar6 = uVar5 - 0x8000;
    if (uVar5 < mqenc->areg + mqenc->creg) {
      uVar6 = uVar5;
    }
    uVar9 = uVar6 << ((byte)mqenc->ctreg & 0x3f);
    mqenc->creg = uVar9;
    lVar12 = mqenc->outbuf;
    if (lVar12 == 0xff) {
LAB_0012432e:
      pjVar11 = mqenc->out;
      if ((pjVar11->flags_ & 7U) == 0) {
        if ((-1 < pjVar11->rwlimit_) && (pjVar11->rwlimit_ <= pjVar11->rwcnt_)) {
          pjVar11->flags_ = pjVar11->flags_ | 4;
          goto LAB_0012433d;
        }
        *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
        iVar4 = pjVar11->cnt_;
        pjVar11->cnt_ = iVar4 + -1;
        if (iVar4 < 1) {
          iVar4 = jas_stream_flushbuf(pjVar11,0xff);
          if (iVar4 == -1) goto LAB_0012433d;
        }
        else {
          pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
          puVar1 = pjVar11->ptr_;
          pjVar11->ptr_ = puVar1 + 1;
          *puVar1 = 0xff;
        }
      }
      else {
LAB_0012433d:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
      uVar9 = 7;
      uVar8 = 0xfffff;
      sVar7 = 0x14;
    }
    else {
      uVar8 = (uint)uVar9;
      if ((uVar8 >> 0x1b & 1) == 0) {
        uVar9 = 8;
        uVar8 = 0x7ffff;
        sVar7 = 0x13;
        if (lVar12 < 0) goto LAB_00124676;
        pjVar11 = mqenc->out;
        if ((pjVar11->flags_ & 7U) == 0) {
          if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
            *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
            iVar4 = pjVar11->cnt_;
            pjVar11->cnt_ = iVar4 + -1;
            if (iVar4 < 1) {
              uVar3 = (uint)lVar12;
LAB_00124668:
              sVar7 = 0x13;
              uVar9 = 8;
              uVar8 = 0x7ffff;
              iVar4 = jas_stream_flushbuf(pjVar11,uVar3 & 0xff);
              if (iVar4 == -1) goto LAB_00124672;
            }
            else {
              pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
              puVar1 = pjVar11->ptr_;
              pjVar11->ptr_ = puVar1 + 1;
              *puVar1 = (uchar)lVar12;
            }
            goto LAB_00124676;
          }
          pjVar11->flags_ = pjVar11->flags_ | 4;
        }
        goto LAB_00124672;
      }
      lVar13 = lVar12 + 1;
      mqenc->outbuf = lVar13;
      if (lVar13 == 0xff) {
        mqenc->creg = (ulong)(uVar8 & 0x7ffffff);
        goto LAB_0012432e;
      }
      uVar9 = 8;
      uVar8 = 0x7ffff;
      sVar7 = 0x13;
      if (-2 < lVar12) {
        pjVar11 = mqenc->out;
        if ((pjVar11->flags_ & 7U) == 0) {
          if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
            *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
            iVar4 = pjVar11->cnt_;
            pjVar11->cnt_ = iVar4 + -1;
            if (iVar4 < 1) {
              uVar3 = (uint)lVar13;
              goto LAB_00124668;
            }
            pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
            puVar1 = pjVar11->ptr_;
            pjVar11->ptr_ = puVar1 + 1;
            *puVar1 = (uchar)lVar13;
            goto LAB_00124676;
          }
          pjVar11->flags_ = pjVar11->flags_ | 4;
        }
LAB_00124672:
        sVar7 = 0x13;
        uVar9 = 8;
        uVar8 = 0x7ffff;
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
    }
LAB_00124676:
    mqenc->lastbyte = mqenc->outbuf;
    uVar6 = mqenc->creg >> sVar7;
    uVar5 = uVar6 & 0xff;
    uVar10 = (ulong)((uint)mqenc->creg & uVar8) << (sbyte)uVar9;
    mqenc->outbuf = uVar5;
    mqenc->ctreg = uVar9;
    mqenc->creg = uVar10;
    if (uVar5 == 0xff) {
LAB_001246ae:
      pjVar11 = mqenc->out;
      if ((pjVar11->flags_ & 7U) == 0) {
        if ((-1 < pjVar11->rwlimit_) && (pjVar11->rwlimit_ <= pjVar11->rwcnt_)) {
          pjVar11->flags_ = pjVar11->flags_ | 4;
          goto LAB_001246bd;
        }
        *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
        iVar4 = pjVar11->cnt_;
        pjVar11->cnt_ = iVar4 + -1;
        if (iVar4 < 1) {
          iVar4 = jas_stream_flushbuf(pjVar11,0xff);
          if (iVar4 == -1) goto LAB_001246bd;
        }
        else {
          pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
          puVar1 = pjVar11->ptr_;
          pjVar11->ptr_ = puVar1 + 1;
          *puVar1 = 0xff;
        }
      }
      else {
LAB_001246bd:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
      uVar9 = 7;
      uVar8 = 0xfffff;
      sVar7 = 0x14;
    }
    else {
      uVar8 = (uint)uVar10;
      if ((uVar8 >> 0x1b & 1) != 0) {
        uVar5 = uVar5 + 1;
        mqenc->outbuf = uVar5;
        if (uVar5 != 0xff) {
          pjVar11 = mqenc->out;
          if ((pjVar11->flags_ & 7U) == 0) {
            if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
              *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
              iVar4 = pjVar11->cnt_;
              pjVar11->cnt_ = iVar4 + -1;
              if (iVar4 < 1) goto LAB_001247e3;
              pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
              puVar1 = pjVar11->ptr_;
              pjVar11->ptr_ = puVar1 + 1;
              *puVar1 = (uchar)uVar5;
              goto LAB_00124801;
            }
            pjVar11->flags_ = pjVar11->flags_ | 4;
          }
          goto LAB_001247fd;
        }
        mqenc->creg = (ulong)(uVar8 & 0x7fffffe);
        goto LAB_001246ae;
      }
      pjVar11 = mqenc->out;
      if ((pjVar11->flags_ & 7U) == 0) {
        if ((-1 < pjVar11->rwlimit_) && (pjVar11->rwlimit_ <= pjVar11->rwcnt_)) {
          pjVar11->flags_ = pjVar11->flags_ | 4;
          goto LAB_001247fd;
        }
        *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
        iVar4 = pjVar11->cnt_;
        pjVar11->cnt_ = iVar4 + -1;
        if (iVar4 < 1) {
LAB_001247e3:
          iVar4 = jas_stream_flushbuf(pjVar11,(int)uVar5);
          if (iVar4 == -1) goto LAB_001247fd;
        }
        else {
          pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
          puVar1 = pjVar11->ptr_;
          pjVar11->ptr_ = puVar1 + 1;
          *puVar1 = (uchar)uVar6;
        }
      }
      else {
LAB_001247fd:
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
      }
LAB_00124801:
      uVar9 = 8;
      uVar8 = 0x7ffff;
      sVar7 = 0x13;
    }
    mqenc->lastbyte = mqenc->outbuf;
    uVar5 = mqenc->creg >> sVar7;
    uVar6 = uVar5 & 0xff;
    mqenc->outbuf = uVar6;
    mqenc->creg = (ulong)((uint)mqenc->creg & uVar8);
    mqenc->ctreg = uVar9;
    if (uVar6 == 0xff) {
      return 0;
    }
    pjVar11 = mqenc->out;
    uVar8 = pjVar11->flags_;
    if ((uVar8 & 7) == 0) {
      if ((-1 < pjVar11->rwlimit_) && (pjVar11->rwlimit_ <= pjVar11->rwcnt_)) goto LAB_001248b5;
      *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
      iVar4 = pjVar11->cnt_;
      pjVar11->cnt_ = iVar4 + -1;
      if (0 < iVar4) {
        pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
        puVar1 = pjVar11->ptr_;
        pjVar11->ptr_ = puVar1 + 1;
        *puVar1 = (uchar)uVar5;
        goto LAB_0012484d;
      }
LAB_001248bd:
      iVar4 = jas_stream_flushbuf(pjVar11,(int)uVar6);
      if (iVar4 != -1) goto LAB_0012484d;
    }
  }
  else {
    if (termmode != 1) {
      abort();
    }
    uVar9 = mqenc->ctreg;
    if ((long)(0xc - uVar9) < 1) {
      uVar6 = mqenc->outbuf;
    }
    else {
      uVar5 = mqenc->creg;
      uVar6 = mqenc->outbuf;
      lVar12 = 0xc - uVar9;
      do {
        uVar9 = uVar5 << ((byte)uVar9 & 0x3f);
        mqenc->creg = uVar9;
        mqenc->ctreg = 0;
        if (uVar6 == 0xff) {
LAB_0012412f:
          pjVar11 = mqenc->out;
          if ((pjVar11->flags_ & 7U) == 0) {
            if ((-1 < pjVar11->rwlimit_) && (pjVar11->rwlimit_ <= pjVar11->rwcnt_)) {
              pjVar11->flags_ = pjVar11->flags_ | 4;
              goto LAB_0012413e;
            }
            *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
            iVar4 = pjVar11->cnt_;
            pjVar11->cnt_ = iVar4 + -1;
            if (iVar4 < 1) {
              iVar4 = jas_stream_flushbuf(pjVar11,0xff);
              if (iVar4 == -1) goto LAB_0012413e;
            }
            else {
              pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
              puVar1 = pjVar11->ptr_;
              pjVar11->ptr_ = puVar1 + 1;
              *puVar1 = 0xff;
            }
          }
          else {
LAB_0012413e:
            *(byte *)&mqenc->err = (byte)mqenc->err | 1;
          }
          uVar9 = 7;
          uVar8 = 0xfffff;
          sVar7 = 0x14;
        }
        else {
          uVar8 = (uint)uVar9;
          if ((uVar8 >> 0x1b & 1) == 0) {
            uVar9 = 8;
            uVar8 = 0x7ffff;
            sVar7 = 0x13;
            if ((long)uVar6 < 0) goto LAB_001242c8;
            pjVar11 = mqenc->out;
            if ((pjVar11->flags_ & 7U) == 0) {
              if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
                *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
                iVar4 = pjVar11->cnt_;
                pjVar11->cnt_ = iVar4 + -1;
                if (iVar4 < 1) {
                  uVar3 = (uint)uVar6;
LAB_001242ba:
                  sVar7 = 0x13;
                  uVar9 = 8;
                  uVar8 = 0x7ffff;
                  iVar4 = jas_stream_flushbuf(pjVar11,uVar3 & 0xff);
                  if (iVar4 == -1) goto LAB_001242c4;
                }
                else {
                  pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
                  puVar1 = pjVar11->ptr_;
                  pjVar11->ptr_ = puVar1 + 1;
                  *puVar1 = (uchar)uVar6;
                }
                goto LAB_001242c8;
              }
              pjVar11->flags_ = pjVar11->flags_ | 4;
            }
            goto LAB_001242c4;
          }
          lVar13 = uVar6 + 1;
          mqenc->outbuf = lVar13;
          if (lVar13 == 0xff) {
            mqenc->creg = (ulong)(uVar8 & 0x7ffffff);
            goto LAB_0012412f;
          }
          uVar9 = 8;
          uVar8 = 0x7ffff;
          sVar7 = 0x13;
          if (-2 < (long)uVar6) {
            pjVar11 = mqenc->out;
            if ((pjVar11->flags_ & 7U) == 0) {
              if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
                *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
                iVar4 = pjVar11->cnt_;
                pjVar11->cnt_ = iVar4 + -1;
                if (iVar4 < 1) {
                  uVar3 = (uint)lVar13;
                  goto LAB_001242ba;
                }
                pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
                puVar1 = pjVar11->ptr_;
                pjVar11->ptr_ = puVar1 + 1;
                *puVar1 = (uchar)lVar13;
                goto LAB_001242c8;
              }
              pjVar11->flags_ = pjVar11->flags_ | 4;
            }
LAB_001242c4:
            sVar7 = 0x13;
            uVar9 = 8;
            uVar8 = 0x7ffff;
            *(byte *)&mqenc->err = (byte)mqenc->err | 1;
          }
        }
LAB_001242c8:
        mqenc->lastbyte = mqenc->outbuf;
        uVar6 = mqenc->creg >> sVar7 & 0xff;
        mqenc->outbuf = uVar6;
        uVar5 = (ulong)((uint)mqenc->creg & uVar8);
        mqenc->creg = uVar5;
        mqenc->ctreg = uVar9;
        lVar13 = lVar12 - uVar9;
        bVar2 = (long)uVar9 <= lVar12;
        lVar12 = lVar13;
      } while (lVar13 != 0 && bVar2);
    }
    if (uVar6 == 0xff) {
      return 0;
    }
    uVar8 = (uint)mqenc->creg;
    if ((uVar8 >> 0x1b & 1) == 0) {
      if ((long)uVar6 < 0) goto LAB_0012484d;
      pjVar11 = mqenc->out;
      if ((pjVar11->flags_ & 7U) == 0) {
        if ((-1 < pjVar11->rwlimit_) && (pjVar11->rwlimit_ <= pjVar11->rwcnt_)) {
          pjVar11->flags_ = pjVar11->flags_ | 4;
          goto LAB_00124849;
        }
        *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
        iVar4 = pjVar11->cnt_;
        pjVar11->cnt_ = iVar4 + -1;
        if (0 < iVar4) {
          pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
          puVar1 = pjVar11->ptr_;
          pjVar11->ptr_ = puVar1 + 1;
          *puVar1 = (uchar)uVar6;
          goto LAB_0012484d;
        }
        uVar6 = uVar6 & 0xff;
        goto LAB_001248bd;
      }
    }
    else {
      uVar5 = uVar6 + 1;
      mqenc->outbuf = uVar5;
      if (uVar5 == 0xff) {
        mqenc->creg = (ulong)(uVar8 & 0x7ffffff);
        pjVar11 = mqenc->out;
        if ((pjVar11->flags_ & 7U) == 0) {
          if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
            *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
            iVar4 = pjVar11->cnt_;
            pjVar11->cnt_ = iVar4 + -1;
            if (0 < iVar4) {
              pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
              puVar1 = pjVar11->ptr_;
              pjVar11->ptr_ = puVar1 + 1;
              *puVar1 = 0xff;
              goto LAB_00124491;
            }
            iVar4 = jas_stream_flushbuf(pjVar11,0xff);
            if (iVar4 != -1) goto LAB_00124491;
          }
          else {
            pjVar11->flags_ = pjVar11->flags_ | 4;
          }
        }
        *(byte *)&mqenc->err = (byte)mqenc->err | 1;
LAB_00124491:
        mqenc->lastbyte = mqenc->outbuf;
        mqenc->outbuf = mqenc->creg >> 0x14 & 0xff;
        mqenc->creg = (ulong)((uint)mqenc->creg & 0xfffff);
        mqenc->ctreg = 7;
        return 0;
      }
      if ((long)uVar6 < -1) goto LAB_0012484d;
      pjVar11 = mqenc->out;
      uVar8 = pjVar11->flags_;
      if ((uVar8 & 7) != 0) goto LAB_00124849;
      if ((pjVar11->rwlimit_ < 0) || (pjVar11->rwcnt_ < pjVar11->rwlimit_)) {
        *(byte *)&pjVar11->bufmode_ = (byte)pjVar11->bufmode_ | 0x20;
        iVar4 = pjVar11->cnt_;
        pjVar11->cnt_ = iVar4 + -1;
        if (0 < iVar4) {
          pjVar11->rwcnt_ = pjVar11->rwcnt_ + 1;
          puVar1 = pjVar11->ptr_;
          pjVar11->ptr_ = puVar1 + 1;
          *puVar1 = (uchar)uVar5;
          goto LAB_0012484d;
        }
        uVar6 = uVar5 & 0xff;
        goto LAB_001248bd;
      }
LAB_001248b5:
      pjVar11->flags_ = uVar8 | 4;
    }
  }
LAB_00124849:
  *(byte *)&mqenc->err = (byte)mqenc->err | 1;
LAB_0012484d:
  mqenc->lastbyte = mqenc->outbuf;
  mqenc->outbuf = mqenc->creg >> 0x13 & 0xff;
  mqenc->creg = (ulong)((uint)mqenc->creg & 0x7ffff);
  mqenc->ctreg = 8;
  return 0;
}

Assistant:

int jpc_mqenc_flush(jpc_mqenc_t *mqenc, int termmode)
{
	int_fast16_t k;

	switch (termmode) {
	case JPC_MQENC_PTERM:
		k = 11 - mqenc->ctreg + 1;
		while (k > 0) {
			mqenc->creg <<= mqenc->ctreg;
			mqenc->ctreg = 0;
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg,
			  mqenc);
			k -= mqenc->ctreg;
		}
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	case JPC_MQENC_DEFTERM:
		jpc_mqenc_setbits(mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		mqenc->creg <<= mqenc->ctreg;
		jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		if (mqenc->outbuf != 0xff) {
			jpc_mqenc_byteout(mqenc->areg, mqenc->creg, mqenc->ctreg, mqenc);
		}
		break;
	default:
		abort();
		break;
	}
	return 0;
}